

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cc
# Opt level: O0

string * __thiscall
phosg::format_duration_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,uint64_t usecs,int8_t subsecond_precision)

{
  undefined1 auVar1 [16];
  reference pvVar2;
  ulong uVar3;
  size_type sVar4;
  long lVar5;
  char *pcVar6;
  bool bVar7;
  undefined4 uVar13;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  string local_138;
  undefined1 local_118 [8];
  string seconds_str_2;
  uint64_t usecs_part_2;
  uint64_t minutes_2;
  uint64_t hours_1;
  uint64_t days;
  undefined1 local_b8 [8];
  string seconds_str_1;
  uint64_t usecs_part_1;
  uint64_t minutes_1;
  uint64_t hours;
  string local_70;
  undefined1 local_50 [8];
  string seconds_str;
  uint64_t usecs_part;
  uint64_t minutes;
  int8_t subsecond_precision_local;
  uint64_t usecs_local;
  
  minutes._7_1_ = (char)usecs;
  uVar13 = (undefined4)((ulong)this >> 0x20);
  if (this < (phosg *)0xf4240) {
    if (minutes._7_1_ < '\0') {
      minutes._7_1_ = '\x06';
    }
    auVar8._8_4_ = uVar13;
    auVar8._0_8_ = this;
    auVar8._12_4_ = 0x45300000;
    string_printf_abi_cxx11_
              (__return_storage_ptr__,"%.*lf",
               ((auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)this) - 4503599627370496.0)) / 1000000.0,
               (ulong)(uint)(int)minutes._7_1_);
  }
  else if (this < (phosg *)0x3938700) {
    if (minutes._7_1_ < '\0') {
      minutes._7_1_ = '\x06';
    }
    auVar9._8_4_ = uVar13;
    auVar9._0_8_ = this;
    auVar9._12_4_ = 0x45300000;
    string_printf_abi_cxx11_
              (__return_storage_ptr__,"%.*lf",
               ((auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)this) - 4503599627370496.0)) / 1000000.0,
               (ulong)(uint)(int)minutes._7_1_);
  }
  else if (this < (phosg *)0xd693a400) {
    if (minutes._7_1_ < '\0') {
      minutes._7_1_ = '\x03';
    }
    seconds_str.field_2._8_8_ = (ulong)this % 60000000;
    auVar10._8_4_ = 0;
    auVar10._0_8_ = seconds_str.field_2._8_8_;
    auVar10._12_4_ = 0x45300000;
    string_printf_abi_cxx11_
              ((string *)local_50,"%.*lf",
               ((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)seconds_str.field_2._8_8_) - 4503599627370496.0)) /
               1000000.0,(ulong)(uint)(int)minutes._7_1_);
    pvVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       ((string *)local_50,1);
    pcVar6 = "";
    if (*pvVar2 == '.') {
      pcVar6 = "0";
    }
    string_printf_abi_cxx11_(&local_70,"%lu:%s",(ulong)this / 60000000,pcVar6);
    ::std::operator+(__return_storage_ptr__,&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)local_50);
  }
  else if (this < (phosg *)0x141dd76000) {
    if (minutes._7_1_ < '\0') {
      minutes._7_1_ = '\0';
    }
    uVar3 = ((ulong)this / 60000000) % 0x3c;
    seconds_str_1.field_2._8_8_ = (ulong)this % 3600000000 + uVar3 * -60000000;
    auVar11._8_4_ = (int)((ulong)seconds_str_1.field_2._8_8_ >> 0x20);
    auVar11._0_8_ = seconds_str_1.field_2._8_8_;
    auVar11._12_4_ = 0x45300000;
    string_printf_abi_cxx11_
              ((string *)local_b8,"%.*lf",
               ((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)seconds_str_1.field_2._8_8_) - 4503599627370496.0))
               / 1000000.0,(ulong)(uint)(int)minutes._7_1_);
    sVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                      );
    bVar7 = true;
    if (sVar4 != 1) {
      pvVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_b8,1);
      bVar7 = *pvVar2 == '.';
    }
    pcVar6 = "";
    if (bVar7) {
      pcVar6 = "0";
    }
    string_printf_abi_cxx11_((string *)&days,"%lu:%02lu:%s",(ulong)this / 3600000000,uVar3,pcVar6);
    ::std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&days,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    ::std::__cxx11::string::~string((string *)&days);
    ::std::__cxx11::string::~string((string *)local_b8);
  }
  else {
    if (minutes._7_1_ < '\0') {
      minutes._7_1_ = '\0';
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (ulong)this / 3600000000;
    lVar5 = (ulong)this / 3600000000 +
            (ulong)(uint)(SUB164(auVar1 * ZEXT816(0xaaaaaaaaaaaaaab),8) << 3) * -3;
    uVar3 = ((ulong)this / 60000000) % 0x3c;
    seconds_str_2.field_2._8_8_ =
         (ulong)this % 86400000000 + lVar5 * -3600000000 + uVar3 * -60000000;
    auVar12._8_4_ = (int)((ulong)seconds_str_2.field_2._8_8_ >> 0x20);
    auVar12._0_8_ = seconds_str_2.field_2._8_8_;
    auVar12._12_4_ = 0x45300000;
    string_printf_abi_cxx11_
              ((string *)local_118,"%.*lf",
               ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)seconds_str_2.field_2._8_8_) - 4503599627370496.0))
               / 1000000.0,(ulong)(uint)(int)minutes._7_1_);
    sVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118);
    bVar7 = true;
    if (sVar4 != 1) {
      pvVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_118,1);
      bVar7 = *pvVar2 == '.';
    }
    pcVar6 = "";
    if (bVar7) {
      pcVar6 = "0";
    }
    string_printf_abi_cxx11_
              (&local_138,"%lu:%02lu:%02lu:%s",(ulong)this / 86400000000,lVar5,uVar3,pcVar6);
    ::std::operator+(__return_storage_ptr__,&local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118)
    ;
    ::std::__cxx11::string::~string((string *)&local_138);
    ::std::__cxx11::string::~string((string *)local_118);
  }
  return __return_storage_ptr__;
}

Assistant:

string format_duration(uint64_t usecs, int8_t subsecond_precision) {
  if (usecs < 1000000ULL) {
    if (subsecond_precision < 0) {
      subsecond_precision = 6;
    }
    return string_printf("%.*lf", subsecond_precision,
        static_cast<double>(usecs) / 1000000ULL);

  } else if (usecs < 60 * 1000000ULL) {
    if (subsecond_precision < 0) {
      subsecond_precision = 6;
    }
    return string_printf("%.*lf", subsecond_precision,
        static_cast<double>(usecs) / 1000000ULL);

  } else if (usecs < 60 * 60 * 1000000ULL) {
    if (subsecond_precision < 0) {
      subsecond_precision = 3;
    }
    uint64_t minutes = usecs / (60 * 1000000ULL);
    uint64_t usecs_part = usecs - (minutes * 60 * 1000000ULL);
    string seconds_str = string_printf("%.*lf", subsecond_precision,
        static_cast<double>(usecs_part) / 1000000ULL);
    return string_printf("%" PRIu64 ":%s", minutes,
               ((seconds_str.at(1) == '.') ? "0" : "")) +
        seconds_str;

  } else if (usecs < 24 * 60 * 60 * 1000000ULL) {
    if (subsecond_precision < 0) {
      subsecond_precision = 0;
    }
    uint64_t hours = usecs / (60 * 60 * 1000000ULL);
    uint64_t minutes = (usecs / (60 * 1000000ULL)) % 60;
    uint64_t usecs_part = usecs - (hours * 60 * 60 * 1000000ULL) - (minutes * 60 * 1000000ULL);
    string seconds_str = string_printf("%.*lf", subsecond_precision,
        static_cast<double>(usecs_part) / 1000000ULL);
    return string_printf("%" PRIu64 ":%02" PRIu64 ":%s", hours, minutes,
               ((seconds_str.size() == 1 || seconds_str.at(1) == '.') ? "0" : "")) +
        seconds_str;

  } else {
    if (subsecond_precision < 0) {
      subsecond_precision = 0;
    }
    uint64_t days = usecs / (24 * 60 * 60 * 1000000ULL);
    uint64_t hours = (usecs / (60 * 60 * 1000000ULL)) % 24;
    uint64_t minutes = (usecs / (60 * 1000000ULL)) % 60;
    uint64_t usecs_part = usecs - (days * 24 * 60 * 60 * 1000000ULL) - (hours * 60 * 60 * 1000000ULL) - (minutes * 60 * 1000000ULL);
    string seconds_str = string_printf("%.*lf", subsecond_precision,
        static_cast<double>(usecs_part) / 1000000ULL);
    return string_printf("%" PRIu64 ":%02" PRIu64 ":%02" PRIu64 ":%s", days,
               hours, minutes, ((seconds_str.size() == 1 || seconds_str.at(1) == '.') ? "0" : "")) +
        seconds_str;
  }
}